

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O1

void __thiscall
CoreML::TreeEnsembleClassifier::setOutputClassList
          (TreeEnsembleClassifier *this,vector<long,_std::allocator<long>_> *classes)

{
  int iVar1;
  Model *pMVar2;
  long lVar3;
  TreeEnsembleClassifier *pTVar4;
  Int64Vector *pIVar5;
  ulong uVar6;
  
  pMVar2 = (this->super_TreeEnsembleBase).super_Model.m_spec.
           super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pMVar2->_oneof_case_[0] != 0x192) {
    Specification::Model::clear_Type(pMVar2);
    pMVar2->_oneof_case_[0] = 0x192;
    pTVar4 = (TreeEnsembleClassifier *)operator_new(0x30);
    Specification::TreeEnsembleClassifier::TreeEnsembleClassifier(pTVar4);
    (pMVar2->Type_).treeensembleclassifier_ = pTVar4;
  }
  pTVar4 = (pMVar2->Type_).treeensembleclassifier_;
  if (pTVar4->_oneof_case_[0] != 0x65) {
    Specification::TreeEnsembleClassifier::clear_ClassLabels(pTVar4);
    pTVar4->_oneof_case_[0] = 0x65;
    pIVar5 = (Int64Vector *)operator_new(0x28);
    Specification::Int64Vector::Int64Vector(pIVar5);
    (pTVar4->ClassLabels_).int64classlabels_ = pIVar5;
  }
  (((pTVar4->ClassLabels_).int64classlabels_)->vector_).current_size_ = 0;
  if ((classes->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (classes->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar6 = 0;
    do {
      pMVar2 = (this->super_TreeEnsembleBase).super_Model.m_spec.
               super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (pMVar2->_oneof_case_[0] != 0x192) {
        Specification::Model::clear_Type(pMVar2);
        pMVar2->_oneof_case_[0] = 0x192;
        pTVar4 = (TreeEnsembleClassifier *)operator_new(0x30);
        Specification::TreeEnsembleClassifier::TreeEnsembleClassifier(pTVar4);
        (pMVar2->Type_).treeensembleclassifier_ = pTVar4;
      }
      pTVar4 = (pMVar2->Type_).treeensembleclassifier_;
      if (pTVar4->_oneof_case_[0] != 0x65) {
        Specification::TreeEnsembleClassifier::clear_ClassLabels(pTVar4);
        pTVar4->_oneof_case_[0] = 0x65;
        pIVar5 = (Int64Vector *)operator_new(0x28);
        Specification::Int64Vector::Int64Vector(pIVar5);
        (pTVar4->ClassLabels_).int64classlabels_ = pIVar5;
      }
      pIVar5 = (pTVar4->ClassLabels_).int64classlabels_;
      lVar3 = (classes->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar6];
      iVar1 = (pIVar5->vector_).total_size_;
      if ((pIVar5->vector_).current_size_ == iVar1) {
        google::protobuf::RepeatedField<long>::Reserve(&pIVar5->vector_,iVar1 + 1);
      }
      iVar1 = (pIVar5->vector_).current_size_;
      (pIVar5->vector_).current_size_ = iVar1 + 1;
      ((pIVar5->vector_).rep_)->elements[iVar1] = lVar3;
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)(classes->super__Vector_base<long,_std::allocator<long>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(classes->super__Vector_base<long,_std::allocator<long>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void TreeEnsembleClassifier::setOutputClassList(const std::vector<int64_t>& classes) {
        m_spec->mutable_treeensembleclassifier()->mutable_int64classlabels()->clear_vector();
        for(size_t i = 0; i < classes.size(); ++i) {
            m_spec->mutable_treeensembleclassifier()->mutable_int64classlabels()->add_vector(classes[i]);
        }
    }